

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O1

suffix_table_type * __thiscall
frozen::boyer_moore_searcher<5UL>::build_suffix_table
          (suffix_table_type *__return_storage_ptr__,boyer_moore_searcher<5UL> *this,
          char (*needle) [6])

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  bool bVar14;
  long local_48 [4];
  suffix_table_type suffix;
  
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  suffix.data_[0] = 0;
  cVar4 = (*needle)[0];
  lVar6 = 4;
  lVar8 = 0;
  lVar11 = 4;
  do {
    lVar1 = lVar11 + 1;
    bVar14 = lVar1 == 5;
    if ((!bVar14) && (cVar4 == (*needle)[lVar1])) {
      pcVar12 = *needle;
      lVar5 = -1;
      do {
        lVar13 = lVar5;
        if (lVar8 == lVar13) break;
        pcVar2 = pcVar12 + 1;
        pcVar3 = pcVar12 + lVar8 + 6;
        pcVar12 = pcVar12 + 1;
        lVar5 = lVar13 + -1;
      } while (*pcVar2 == *pcVar3);
      bVar14 = 4U - lVar11 <= (ulong)-lVar13;
    }
    if (bVar14) {
      lVar6 = lVar1;
    }
    local_48[lVar11] = (lVar6 - lVar11) + 4;
    lVar8 = lVar8 + -1;
    bVar14 = lVar11 != 0;
    lVar11 = lVar11 + -1;
  } while (bVar14);
  uVar7 = 0;
  do {
    if (uVar7 == 0) {
      uVar10 = 0;
    }
    else {
      uVar9 = 0;
      pcVar12 = *needle + 4;
      do {
        uVar10 = uVar9;
        if (pcVar12[uVar7 - 4] != *pcVar12) break;
        uVar9 = uVar9 + 1;
        pcVar12 = pcVar12 + -1;
        uVar10 = uVar7;
      } while (uVar7 != uVar9);
    }
    if (uVar7 <= uVar10) {
      uVar10 = uVar7;
    }
    if (*(char *)((long)needle + (uVar7 - uVar10)) != *(char *)((long)needle + (4 - uVar10))) {
      local_48[4 - uVar10] = (uVar10 - uVar7) + 4;
    }
    uVar7 = uVar7 + 1;
    if (uVar7 == 4) {
      __return_storage_ptr__->data_[4] = suffix.data_[0];
      __return_storage_ptr__->data_[2] = local_48[2];
      __return_storage_ptr__->data_[3] = local_48[3];
      __return_storage_ptr__->data_[0] = local_48[0];
      __return_storage_ptr__->data_[1] = local_48[1];
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

constexpr auto build_suffix_table(char const (&needle)[size + 1]) {
    suffix_table_type suffix;
    std::ptrdiff_t last_prefix_index = size - 1;

    // first loop
    for (std::ptrdiff_t p = size - 1; p >= 0; p--) {
      if (is_prefix(needle, p + 1))
        last_prefix_index = p + 1;

      suffix[p] = last_prefix_index + (size - 1 - p);
    }

    // second loop
    for (std::size_t p = 0; p < size - 1; p++) {
      auto slen = suffix_length(needle, p);
      if (needle[p - slen] != needle[size - 1 - slen])
        suffix[size - 1 - slen] = size - 1 - p + slen;

    }
    return suffix;
  }